

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureTransform.cpp
# Opt level: O1

void __thiscall
Assimp::TextureTransformStep::PreProcessUVTransform
          (TextureTransformStep *this,STransformVecInfo *info)

{
  aiTextureMapMode aVar1;
  uint uVar2;
  Logger *pLVar3;
  char *pcVar4;
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  undefined4 uVar8;
  char szTemp [512];
  long *local_3b8;
  long local_3a8 [2];
  char local_398 [512];
  undefined1 local_198 [376];
  
  fVar7 = (info->super_aiUVTransform).mRotation;
  fVar5 = 0.0;
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
    if ((int)(fVar7 / 6.2831855) != 0) {
      pLVar3 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[29]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 (char (*) [29])"Texture coordinate rotation ");
      std::ostream::_M_insert<double>((double)(info->super_aiUVTransform).mRotation);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198," can be simplified to ",0x16);
      fVar7 = fVar7 + (float)(int)(fVar7 / 6.2831855) * -3.1415927;
      std::ostream::_M_insert<double>((double)fVar7);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar3,(char *)local_3b8);
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8,local_3a8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    }
    (info->super_aiUVTransform).mRotation =
         (ai_real)(~-(uint)(fVar7 < 0.0) & (uint)fVar7 |
                  (uint)(fVar7 + 12.566371) & -(uint)(fVar7 < 0.0));
    return;
  }
  fVar7 = (info->super_aiUVTransform).mTranslation.x;
  uVar2 = (uint)fVar7;
  if (uVar2 != 0) {
    local_398[0] = '\0';
    aVar1 = info->mapU;
    if (aVar1 == aiTextureMapMode_Wrap) {
      uVar6 = SUB84((double)fVar7,0);
      fVar5 = fVar7 - (float)(int)uVar2;
      uVar8 = SUB84((double)fVar5,0);
      pcVar4 = "[w] UV U offset %f can be simplified to %f";
LAB_003e08de:
      snprintf(local_398,0x200,pcVar4,uVar6,uVar8);
    }
    else {
      if (uVar2 != 1 && aVar1 == aiTextureMapMode_Mirror) {
        uVar6 = SUB84((double)fVar7,0);
        fVar5 = fVar7 - (float)(int)(uVar2 & 0xfffffffe);
        uVar8 = SUB84((double)fVar5,0);
        pcVar4 = "[m/d] UV U offset %f can be simplified to %f";
        goto LAB_003e08de;
      }
      if ((aVar1 | aiTextureMapMode_Mirror) == aiTextureMapMode_Decal) {
        snprintf(local_398,0x200,"[c] UV U offset %f can be clamped to 1.0f",SUB84((double)fVar7,0))
        ;
        fVar5 = 1.0;
      }
    }
    if (local_398[0] != '\0') {
      pLVar3 = DefaultLogger::get();
      Logger::info(pLVar3,local_398);
      (info->super_aiUVTransform).mTranslation.x = fVar5;
    }
  }
  fVar7 = (info->super_aiUVTransform).mTranslation.y;
  uVar2 = (uint)fVar7;
  if (uVar2 == 0) {
    return;
  }
  local_398[0] = '\0';
  aVar1 = info->mapV;
  if (aVar1 == aiTextureMapMode_Wrap) {
    uVar6 = SUB84((double)fVar7,0);
    fVar5 = fVar7 - (float)(int)uVar2;
    uVar8 = SUB84((double)fVar5,0);
    pcVar4 = "[w] UV V offset %f can be simplified to %f";
  }
  else {
    if (uVar2 == 1 || aVar1 != aiTextureMapMode_Mirror) {
      if ((aVar1 | aiTextureMapMode_Mirror) == aiTextureMapMode_Decal) {
        snprintf(local_398,0x200,"[c] UV V offset %f canbe clamped to 1.0f",SUB84((double)fVar7,0));
        fVar5 = 1.0;
      }
      else {
        fVar5 = 0.0;
      }
      goto LAB_003e0a17;
    }
    fVar5 = (info->super_aiUVTransform).mTranslation.x - (float)(int)(uVar2 & 0xfffffffe);
    uVar6 = SUB84((double)fVar7,0);
    uVar8 = SUB84((double)fVar5,0);
    pcVar4 = "[m/d] UV V offset %f can be simplified to %f";
  }
  snprintf(local_398,0x200,pcVar4,uVar6,uVar8);
LAB_003e0a17:
  if (local_398[0] != '\0') {
    pLVar3 = DefaultLogger::get();
    Logger::info(pLVar3,local_398);
    (info->super_aiUVTransform).mTranslation.y = fVar5;
  }
  return;
}

Assistant:

void TextureTransformStep::PreProcessUVTransform(STransformVecInfo& info)
{
    /*  This function tries to simplify the input UV transformation.
     *  That's very important as it allows us to reduce the number
     *  of output UV channels. The order in which the transformations
     *  are applied is - as always - scaling, rotation, translation.
     */

    char szTemp[512];
    int rounded = 0;


    /* Optimize the rotation angle. That's slightly difficult as
     * we have an inprecise floating-point number (when comparing
     * UV transformations we'll take that into account by using
     * an epsilon of 5 degrees). If there is a rotation value, we can't
     * perform any further optimizations.
     */
    if (info.mRotation)
    {
        float out = info.mRotation;
        if ((rounded = static_cast<int>((info.mRotation / static_cast<float>(AI_MATH_TWO_PI)))))
        {
            out -= rounded * static_cast<float>(AI_MATH_PI);
            ASSIMP_LOG_INFO_F("Texture coordinate rotation ", info.mRotation, " can be simplified to ", out);
        }

        // Next step - convert negative rotation angles to positives
        if (out < 0.f)
            out = (float)AI_MATH_TWO_PI * 2 + out;

        info.mRotation = out;
        return;
    }


    /* Optimize UV translation in the U direction. To determine whether
     * or not we can optimize we need to look at the requested mapping
     * type (e.g. if mirroring is active there IS a difference between
     * offset 2 and 3)
     */
    if ((rounded  = (int)info.mTranslation.x))  {
        float out = 0.0f;
        szTemp[0] = 0;
        if (aiTextureMapMode_Wrap == info.mapU) {
            // Wrap - simple take the fraction of the field
            out = info.mTranslation.x-(float)rounded;
			ai_snprintf(szTemp, 512, "[w] UV U offset %f can be simplified to %f", info.mTranslation.x, out);
        }
        else if (aiTextureMapMode_Mirror == info.mapU && 1 != rounded)  {
            // Mirror
            if (rounded % 2)
                rounded--;
            out = info.mTranslation.x-(float)rounded;

            ai_snprintf(szTemp,512,"[m/d] UV U offset %f can be simplified to %f",info.mTranslation.x,out);
        }
        else if (aiTextureMapMode_Clamp == info.mapU || aiTextureMapMode_Decal == info.mapU)    {
            // Clamp - translations beyond 1,1 are senseless
            ai_snprintf(szTemp,512,"[c] UV U offset %f can be clamped to 1.0f",info.mTranslation.x);

            out = 1.f;
        }
        if (szTemp[0])      {
            ASSIMP_LOG_INFO(szTemp);
            info.mTranslation.x = out;
        }
    }

    /* Optimize UV translation in the V direction. To determine whether
     * or not we can optimize we need to look at the requested mapping
     * type (e.g. if mirroring is active there IS a difference between
     * offset 2 and 3)
     */
    if ((rounded  = (int)info.mTranslation.y))  {
        float out = 0.0f;
        szTemp[0] = 0;
        if (aiTextureMapMode_Wrap == info.mapV) {
            // Wrap - simple take the fraction of the field
            out = info.mTranslation.y-(float)rounded;
            ::ai_snprintf(szTemp,512,"[w] UV V offset %f can be simplified to %f",info.mTranslation.y,out);
        }
        else if (aiTextureMapMode_Mirror == info.mapV  && 1 != rounded) {
            // Mirror
            if (rounded % 2)
                rounded--;
            out = info.mTranslation.x-(float)rounded;

            ::ai_snprintf(szTemp,512,"[m/d] UV V offset %f can be simplified to %f",info.mTranslation.y,out);
        }
        else if (aiTextureMapMode_Clamp == info.mapV || aiTextureMapMode_Decal == info.mapV)    {
            // Clamp - translations beyond 1,1 are senseless
            ::ai_snprintf(szTemp,512,"[c] UV V offset %f canbe clamped to 1.0f",info.mTranslation.y);

            out = 1.f;
        }
        if (szTemp[0])  {
            ASSIMP_LOG_INFO(szTemp);
            info.mTranslation.y = out;
        }
    }
    return;
}